

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::Texture(Texture *this,Texture *copy)

{
  Uint64 UVar1;
  bool bVar2;
  ostream *poVar3;
  Lock lock;
  Lock local_20;
  
  GlResource::GlResource((GlResource *)this);
  (this->m_size).x = 0;
  (this->m_size).y = 0;
  (this->m_actualSize).x = 0;
  (this->m_actualSize).y = 0;
  this->m_texture = 0;
  this->m_isSmooth = copy->m_isSmooth;
  this->m_sRgb = copy->m_sRgb;
  this->m_isRepeated = copy->m_isRepeated;
  this->m_pixelsFlipped = false;
  this->m_fboAttachment = false;
  this->m_hasMipmap = false;
  Lock::Lock(&local_20,(Mutex *)&(anonymous_namespace)::TextureImpl::idMutex);
  UVar1 = (anonymous_namespace)::TextureImpl::getUniqueId()::id;
  (anonymous_namespace)::TextureImpl::getUniqueId()::id =
       (anonymous_namespace)::TextureImpl::getUniqueId()::id + 1;
  Lock::~Lock(&local_20);
  this->m_cacheId = UVar1;
  if (copy->m_texture != 0) {
    bVar2 = create(this,(copy->m_size).x,(copy->m_size).y);
    if (bVar2) {
      update(this,copy,0,0);
    }
    else {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Failed to copy texture, failed to create new texture",0x34);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

Texture::Texture(const Texture& copy) :
m_size         (0, 0),
m_actualSize   (0, 0),
m_texture      (0),
m_isSmooth     (copy.m_isSmooth),
m_sRgb         (copy.m_sRgb),
m_isRepeated   (copy.m_isRepeated),
m_pixelsFlipped(false),
m_fboAttachment(false),
m_hasMipmap    (false),
m_cacheId      (TextureImpl::getUniqueId())
{
    if (copy.m_texture)
    {
        if (create(copy.getSize().x, copy.getSize().y))
        {
            update(copy);
        }
        else
        {
            err() << "Failed to copy texture, failed to create new texture" << std::endl;
        }
    }
}